

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O3

void lowbd_fwd_txfm2d_32x32_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  int8_t *piVar8;
  bool bVar9;
  int16_t *piVar10;
  uint uVar11;
  undefined7 in_register_00000009;
  long lVar12;
  ulong uVar13;
  long lVar14;
  longlong *plVar15;
  bool bVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  __m256i buf0 [32];
  __m256i buf1 [128];
  code *local_1480;
  int16_t *local_1478;
  code *local_1470;
  int32_t *local_1468;
  longlong local_1460 [256];
  longlong local_c60 [390];
  
  piVar8 = av1_fwd_txfm_shift_ls[3];
  uVar13 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  local_1480 = *(code **)((long)col_txfm16x32_arr + uVar13);
  local_1470 = *(code **)((long)row_txfm16x32_arr + uVar13);
  lVar14 = 0;
  bVar9 = true;
  local_1478 = input;
  local_1468 = output;
  do {
    bVar16 = bVar9;
    piVar10 = local_1478 + lVar14 * 0x10;
    if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
      lVar12 = 0x400;
      do {
        uVar2 = *(undefined8 *)(piVar10 + 4);
        uVar3 = *(undefined8 *)(piVar10 + 8);
        uVar4 = *(undefined8 *)(piVar10 + 0xc);
        *(undefined8 *)((long)&local_1480 + lVar12) = *(undefined8 *)piVar10;
        *(undefined8 *)((long)&local_1478 + lVar12) = uVar2;
        *(undefined8 *)((long)&local_1470 + lVar12) = uVar3;
        *(undefined8 *)((long)&local_1468 + lVar12) = uVar4;
        piVar10 = piVar10 + stride;
        lVar12 = lVar12 + -0x20;
      } while (lVar12 != 0);
    }
    else {
      lVar12 = 0;
      do {
        uVar2 = *(undefined8 *)(piVar10 + 4);
        uVar3 = *(undefined8 *)(piVar10 + 8);
        uVar4 = *(undefined8 *)(piVar10 + 0xc);
        *(undefined8 *)((long)local_1460 + lVar12) = *(undefined8 *)piVar10;
        *(undefined8 *)((long)local_1460 + lVar12 + 8) = uVar2;
        *(undefined8 *)((long)local_1460 + lVar12 + 0x10) = uVar3;
        *(undefined8 *)((long)local_1460 + lVar12 + 0x18) = uVar4;
        lVar12 = lVar12 + 0x20;
        piVar10 = piVar10 + stride;
      } while (lVar12 != 0x400);
    }
    bVar1 = *piVar8;
    uVar11 = (uint)(char)bVar1;
    if ((int)uVar11 < 0) {
      auVar17._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
      auVar17._2_2_ = auVar17._0_2_;
      auVar17._4_2_ = auVar17._0_2_;
      auVar17._6_2_ = auVar17._0_2_;
      auVar17._8_2_ = auVar17._0_2_;
      auVar17._10_2_ = auVar17._0_2_;
      auVar17._12_2_ = auVar17._0_2_;
      auVar17._14_2_ = auVar17._0_2_;
      auVar17._16_2_ = auVar17._0_2_;
      auVar17._18_2_ = auVar17._0_2_;
      auVar17._20_2_ = auVar17._0_2_;
      auVar17._22_2_ = auVar17._0_2_;
      auVar17._24_2_ = auVar17._0_2_;
      auVar17._26_2_ = auVar17._0_2_;
      auVar17._28_2_ = auVar17._0_2_;
      auVar17._30_2_ = auVar17._0_2_;
      lVar12 = 0;
      do {
        auVar18 = vpaddsw_avx2(auVar17,*(undefined1 (*) [32])((long)local_1460 + lVar12));
        auVar18 = vpsraw_avx2(auVar18,ZEXT416(-uVar11));
        *(undefined1 (*) [32])((long)local_1460 + lVar12) = auVar18;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x400);
    }
    else if (bVar1 != 0) {
      lVar12 = 0;
      do {
        auVar17 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_1460 + lVar12),ZEXT416(uVar11));
        *(undefined1 (*) [32])((long)local_1460 + lVar12) = auVar17;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x400);
    }
    (*local_1480)((__m256i *)local_1460,(__m256i *)local_1460,0xc);
    bVar1 = piVar8[1];
    uVar11 = (uint)(char)bVar1;
    if ((int)uVar11 < 0) {
      auVar18._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
      auVar18._2_2_ = auVar18._0_2_;
      auVar18._4_2_ = auVar18._0_2_;
      auVar18._6_2_ = auVar18._0_2_;
      auVar18._8_2_ = auVar18._0_2_;
      auVar18._10_2_ = auVar18._0_2_;
      auVar18._12_2_ = auVar18._0_2_;
      auVar18._14_2_ = auVar18._0_2_;
      auVar18._16_2_ = auVar18._0_2_;
      auVar18._18_2_ = auVar18._0_2_;
      auVar18._20_2_ = auVar18._0_2_;
      auVar18._22_2_ = auVar18._0_2_;
      auVar18._24_2_ = auVar18._0_2_;
      auVar18._26_2_ = auVar18._0_2_;
      auVar18._28_2_ = auVar18._0_2_;
      auVar18._30_2_ = auVar18._0_2_;
      lVar12 = 0;
      do {
        auVar17 = vpaddsw_avx2(auVar18,*(undefined1 (*) [32])((long)local_1460 + lVar12));
        auVar17 = vpsraw_avx2(auVar17,ZEXT416(-uVar11));
        *(undefined1 (*) [32])((long)local_1460 + lVar12) = auVar17;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x400);
    }
    else if (bVar1 != 0) {
      lVar12 = 0;
      do {
        auVar17 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_1460 + lVar12),ZEXT416(uVar11));
        *(undefined1 (*) [32])((long)local_1460 + lVar12) = auVar17;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x400);
    }
    transpose_16bit_16x16_avx2((__m256i *)local_1460,(__m256i *)(local_1460 + lVar14 * 0x40 + 0x80))
    ;
    transpose_16bit_16x16_avx2
              ((__m256i *)(local_1460 + 0x40),(__m256i *)(local_c60 + lVar14 * 0x40));
    lVar14 = 1;
    bVar9 = false;
  } while (bVar16);
  lVar14 = 0;
  bVar9 = true;
  do {
    bVar16 = bVar9;
    plVar15 = local_1460 + lVar14 * 0x80 + 0x80;
    if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
      lVar12 = 0x400;
      do {
        lVar5 = plVar15[1];
        lVar6 = plVar15[2];
        lVar7 = plVar15[3];
        *(longlong *)((long)&local_1480 + lVar12) = *plVar15;
        *(longlong *)((long)&local_1478 + lVar12) = lVar5;
        *(longlong *)((long)&local_1470 + lVar12) = lVar6;
        *(longlong *)((long)&local_1468 + lVar12) = lVar7;
        plVar15 = plVar15 + 4;
        lVar12 = lVar12 + -0x20;
      } while (lVar12 != 0);
      plVar15 = local_1460;
    }
    (*local_1470)(plVar15,plVar15,0xc);
    bVar1 = piVar8[2];
    if ((char)bVar1 < '\0') {
      auVar19._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
      auVar19._2_2_ = auVar19._0_2_;
      auVar19._4_2_ = auVar19._0_2_;
      auVar19._6_2_ = auVar19._0_2_;
      auVar19._8_2_ = auVar19._0_2_;
      auVar19._10_2_ = auVar19._0_2_;
      auVar19._12_2_ = auVar19._0_2_;
      auVar19._14_2_ = auVar19._0_2_;
      auVar19._16_2_ = auVar19._0_2_;
      auVar19._18_2_ = auVar19._0_2_;
      auVar19._20_2_ = auVar19._0_2_;
      auVar19._22_2_ = auVar19._0_2_;
      auVar19._24_2_ = auVar19._0_2_;
      auVar19._26_2_ = auVar19._0_2_;
      auVar19._28_2_ = auVar19._0_2_;
      auVar19._30_2_ = auVar19._0_2_;
      lVar12 = 0;
      do {
        auVar17 = vpaddsw_avx2(auVar19,*(undefined1 (*) [32])((long)plVar15 + lVar12));
        auVar17 = vpsraw_avx2(auVar17,ZEXT416((uint)-(int)(char)bVar1));
        *(undefined1 (*) [32])((long)plVar15 + lVar12) = auVar17;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x400);
    }
    else if (bVar1 != 0) {
      lVar12 = 0;
      do {
        auVar17 = vpsllw_avx2(*(undefined1 (*) [32])((long)plVar15 + lVar12),
                              ZEXT416((uint)(int)(char)bVar1));
        *(undefined1 (*) [32])((long)plVar15 + lVar12) = auVar17;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x400);
    }
    lVar12 = 0;
    do {
      auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)plVar15 + lVar12));
      auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)plVar15 + lVar12 + 0x10));
      *(undefined1 (*) [32])(local_1468 + lVar14 * 0x10 + lVar12) = auVar17;
      *(undefined1 (*) [32])(local_1468 + lVar14 * 0x10 + lVar12 + 8) = auVar18;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0x400);
    lVar14 = 1;
    bVar9 = false;
  } while (bVar16);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_32x32_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  const TX_SIZE tx_size = TX_32X32;
  __m256i buf0[32], buf1[128];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = col_txfm16x32_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm16x32_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  for (int i = 0; i < 2; i++) {
    if (ud_flip) {
      load_buffer_16bit_to_16bit_flip_avx2(input + 16 * i, stride, buf0,
                                           height);
    } else {
      load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    }
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    transpose_16bit_16x16_avx2(buf0 + 0 * 16, buf1 + 0 * width + 16 * i);
    transpose_16bit_16x16_avx2(buf0 + 1 * 16, buf1 + 1 * width + 16 * i);
  }

  for (int i = 0; i < 2; i++) {
    __m256i *buf;
    if (lr_flip) {
      buf = buf0;
      flip_buf_avx2(buf1 + width * i, buf, width);
    } else {
      buf = buf1 + width * i;
    }
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit_w16_avx2(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w16_avx2(buf, output + i * 16, height, width);
  }
}